

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O3

bsc_step_t
bsc_get(bsc_step_t depends,bsc_pid_t src_pid,void *src,bsc_size_t offset,void *dst,bsc_size_t size)

{
  bsp_pid_t bVar1;
  request_t *prVar2;
  
  bVar1 = bsp_pid();
  prVar2 = new_request(depends);
  prVar2->kind = GET;
  (prVar2->payload).put.src_addr = src;
  (prVar2->payload).put.dst_addr = dst;
  (prVar2->payload).put.src_pid = src_pid;
  (prVar2->payload).put.dst_pid = bVar1;
  (prVar2->payload).put.size = size;
  (prVar2->payload).put.offset = offset;
  return depends + 1;
}

Assistant:

bsc_step_t bsc_get( bsc_step_t depends, bsc_pid_t src_pid, 
        const void * src, bsc_size_t offset, void * dst, bsc_size_t size )
{
    request_t * req;
    comm_request_t r;
    r.src_addr = src;
    r.dst_addr = dst;
    r.dst_pid = bsp_pid();
    r.src_pid = src_pid;
    r.size = size;
    r.offset = offset;
        
    req = new_request( depends );
    req->kind = GET;
    req->payload.get = r;
    return depends + 1;
}